

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

void __thiscall gutil::Parameter::printHelp(Parameter *this,ostream *out,size_t columns)

{
  ostream *poVar1;
  size_type sVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  string *descr_00;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  pointer pbVar8;
  long lVar9;
  string descr;
  string val_1;
  string val;
  string local_70;
  string local_50;
  
  if ((this->creat)._M_string_length != 0) {
    poVar1 = std::operator<<(out,(string *)&this->creat);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  lVar9 = 0;
  uVar6 = 0;
  uVar7 = 0;
  while( true ) {
    pbVar8 = (this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar3 - (long)pbVar8 >> 5) <= uVar7) break;
    anon_unknown_4::getValue(&val,(string *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9));
    if (val._M_string_length == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = val._M_string_length;
      if (*val._M_dataplus._M_p == '<') {
        sVar2 = val._M_string_length +
                (**(char **)((long)&(((this->def).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar9) == ' ');
      }
    }
    if (uVar6 <= sVar2) {
      uVar6 = sVar2;
    }
    std::__cxx11::string::~string((string *)&val);
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 0x20;
  }
  uVar7 = columns >> 1;
  if (uVar6 + 1 < columns >> 1) {
    uVar7 = uVar6 + 1;
  }
  for (uVar6 = 0; uVar6 < (ulong)((long)pbVar3 - (long)pbVar8 >> 5); uVar6 = uVar6 + 1) {
    anon_unknown_4::getValue(&val_1,pbVar8 + uVar6);
    pbVar3 = (this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = pbVar3 + uVar6;
    descr._M_dataplus._M_p = (pointer)&descr.field_2;
    descr._M_string_length = 0;
    descr.field_2._M_local_buf[0] = '\0';
    uVar4 = std::__cxx11::string::find((char)pbVar8,0x23);
    if (uVar4 < pbVar3[uVar6]._M_string_length) {
      std::__cxx11::string::substr((ulong)&val,(ulong)pbVar8);
      std::__cxx11::string::operator=((string *)&descr,(string *)&val);
      std::__cxx11::string::~string((string *)&val);
    }
    trim(&descr);
    if (val_1._M_string_length == 0) {
      descr_00 = &local_50;
      std::__cxx11::string::string((string *)descr_00,(string *)&descr);
      anon_unknown_4::printDescription(out,descr_00,0,columns);
    }
    else {
      if ((*val_1._M_dataplus._M_p == '-') ||
         (*(this->def).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p != ' ')) {
        lVar9 = 0;
      }
      else {
        std::operator<<(out,"  ");
        lVar9 = 2;
      }
      std::operator<<(out,(string *)&val_1);
      uVar5 = lVar9 + val_1._M_string_length;
      for (uVar4 = uVar5; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        std::operator<<(out,' ');
      }
      if (uVar7 < uVar5) {
        std::endl<char,std::char_traits<char>>(out);
      }
      std::__cxx11::string::string((string *)&local_70,(string *)&descr);
      descr_00 = &local_70;
      anon_unknown_4::printDescription(out,descr_00,uVar7,columns);
    }
    std::__cxx11::string::~string((string *)descr_00);
    std::__cxx11::string::~string((string *)&descr);
    std::__cxx11::string::~string((string *)&val_1);
    pbVar8 = (this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void Parameter::printHelp(std::ostream &out, size_t columns)
const
{
  size_t col1=0;

  if (creat.size() > 0)
  {
    out << creat << std::endl;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    size_t n=val.size();

    if (n > 0 && val[0] == '<' && def[i][0] == ' ')
    {
      n++;
    }

    col1=std::max(col1, n);
  }

  col1++;

  if (col1 > columns/2)
  {
    col1=columns/2;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    std::string descr=getDescription(def[i]);

    if (val.size() > 0)
    {
      size_t n=0;

      if (val[0] != '-' && def[i][0] == ' ')
      {
        out << "  ";
        n+=2;
      }

      out << val;
      n+=val.length();

      while (n < col1)
      {
        out << ' ';
        n++;
      }

      if (n > col1)
      {
        out << std::endl;
        n=0;
      }

      printDescription(out, descr, col1, columns);
    }
    else
    {
      printDescription(out, descr, 0, columns);
    }
  }
}